

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sh4asm_txt_emit.h
# Opt level: O0

char * sh4asm_fr_reg_str(uint idx)

{
  uint idx_local;
  
  return sh4asm_fr_reg_str::names[idx & 0xf];
}

Assistant:

static char const *sh4asm_fr_reg_str(unsigned idx) {
    static char const *names[16] = {
        "fr0",  "fr1",  "fr2",  "fr3",
        "fr4",  "fr5",  "fr6",  "fr7",
        "fr8",  "fr9",  "fr10", "fr11",
        "fr12", "fr13", "fr14", "fr15"
    };
    return names[idx & 15];
}